

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_constant_expression.cpp
# Opt level: O0

uint32_t bitfield_insert(uint32_t base,uint32_t insert,int offset,int bits)

{
  uint uVar1;
  uint insert_mask;
  int bits_local;
  int offset_local;
  uint32_t insert_local;
  uint32_t base_local;
  
  insert_local = base;
  if (bits != 0) {
    if ((offset < 0) || (bits < 0)) {
      insert_local = 0;
    }
    else if (offset + bits < 0x21) {
      uVar1 = (uint)((1L << ((byte)bits & 0x3f)) + -1 << ((byte)offset & 0x3f));
      insert_local = (uVar1 ^ 0xffffffff) & base | uVar1 & insert << ((byte)offset & 0x1f);
    }
    else {
      insert_local = 0;
    }
  }
  return insert_local;
}

Assistant:

static uint32_t
bitfield_insert(uint32_t base, uint32_t insert, int offset, int bits)
{
   if (bits == 0)
      return base;
   else if (offset < 0 || bits < 0)
      return 0; /* Undefined, per spec. */
   else if (offset + bits > 32)
      return 0; /* Undefined, per spec. */
   else {
      unsigned insert_mask = ((1ull << bits) - 1) << offset;

      insert <<= offset;
      insert &= insert_mask;
      base &= ~insert_mask;

      return base | insert;
   }
}